

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O0

bool midi_processor::is_riff_midi(vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  size_type sVar5;
  int *piVar6;
  const_reference pvVar7;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  uchar *local_50;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  uint32_t data_size;
  uint32_t riff_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
  if ((0x13 < sVar5) &&
     (piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (p_file,0), *piVar6 == 0x46464952)) {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,6);
    vVar3 = *pvVar7;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,7);
    test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         CONCAT13(*pvVar7,CONCAT12(vVar3,CONCAT11(vVar2,vVar1)));
    if ((0xb < test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_) &&
       (sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file),
       test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ + 8 <= sVar5)) {
      piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (p_file,8);
      if ((*piVar6 != 0x44494d52) ||
         (piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    (p_file,0xc), *piVar6 != 0x61746164)) {
        return false;
      }
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,0x10);
      test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = toInt32LE(pvVar7);
      if ((0x11 < (uint32_t)
                  test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) &&
         ((sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file),
          (uint32_t)
          test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 0x14 <= sVar5 &&
          ((uint32_t)
           test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 0xc <=
           test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_)))) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        local_48._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
        local_40 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_48,0x14);
        local_60._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
        local_58 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_60,0x14);
        local_50 = (uchar *)__gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+(&local_58,0x12);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_38,local_40,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_50);
        bVar4 = is_standard_midi((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        return bVar4;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool midi_processor::is_riff_midi( std::vector<uint8_t> const& p_file )
{
    if ( p_file.size() < 20 ) return false;
    if ( memcmp( &p_file[ 0 ], "RIFF", 4 ) != 0 ) return false;
    uint32_t riff_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );
    if ( riff_size < 12 || ( p_file.size() < riff_size + 8 ) ) return false;
    if ( memcmp( &p_file[ 8 ], "RMID", 4 ) != 0 ||
         memcmp( &p_file[ 12 ], "data", 4 ) != 0 ) return false;
    uint32_t data_size = toInt32LE(&p_file[ 16 ]);
    if ( data_size < 18 || p_file.size() < data_size + 20 || riff_size < data_size + 12 ) return false;
    std::vector<uint8_t> test;
    test.assign( p_file.begin() + 20, p_file.begin() + 20 + 18 );
    return is_standard_midi( test );
}